

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support_p.h
# Opt level: O0

size_t asmjit::_abi_1_10::Support::decodeInstName(char *nameOut,uint32_t index,char *stringTable)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  uint in_ESI;
  long in_RDI;
  char *suffixOut;
  size_t suffixSize;
  size_t suffixBase;
  size_t prefixSize;
  size_t prefixBase;
  uint32_t c;
  size_t i;
  ulong local_28;
  uint local_14;
  size_t local_8;
  
  if ((in_ESI & 0x80000000) == 0) {
    uVar2 = (ulong)(in_ESI >> 0xc & 0xf);
    uVar3 = (ulong)(in_ESI >> 0x1c & 7);
    for (local_28 = 0; local_28 < uVar2; local_28 = local_28 + 1) {
      *(undefined1 *)(in_RDI + local_28) =
           *(undefined1 *)(CONCAT71(in_register_00000011,in_DL) + (in_ESI & 0xfff) + local_28);
    }
    for (local_28 = 0; local_28 < uVar3; local_28 = local_28 + 1) {
      *(undefined1 *)(in_RDI + uVar2 + local_28) =
           *(undefined1 *)
            (CONCAT71(in_register_00000011,in_DL) + (in_ESI >> 0x10 & 0xfff) + local_28);
    }
    local_8 = uVar2 + uVar3;
  }
  else {
    local_28 = 0;
    for (local_14 = in_ESI; (local_28 < 6 && ((local_14 & 0x1f) != 0)); local_14 = local_14 >> 5) {
      cVar1 = decode5BitChar(local_14 & 0x1f);
      *(char *)(in_RDI + local_28) = cVar1;
      local_28 = local_28 + 1;
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

static ASMJIT_FORCE_INLINE size_t decodeInstName(char nameOut[32], uint32_t index, const char* stringTable) noexcept {
  size_t i;

  if (index & 0x80000000u) {
    // Small string of 5-bit characters.
    for (i = 0; i < 6; i++, index >>= 5) {
      uint32_t c = index & 0x1F;
      if (c == 0)
        break;
      nameOut[i] = decode5BitChar(c);
    }
    return i;
  }
  else {
    size_t prefixBase = index & 0xFFFu;
    size_t prefixSize = (index >> 12) & 0xFu;

    size_t suffixBase = (index >> 16) & 0xFFFu;
    size_t suffixSize = (index >> 28) & 0x7u;

    for (i = 0; i < prefixSize; i++)
      nameOut[i] = stringTable[prefixBase + i];

    char* suffixOut = nameOut + prefixSize;
    for (i = 0; i < suffixSize; i++)
      suffixOut[i] = stringTable[suffixBase + i];

    return prefixSize + suffixSize;
  }
}